

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_12::ScanLineProcess::update_pointers
          (ScanLineProcess *this,DeepFrameBuffer *outfb,int fbY,int fbLastY)

{
  long lVar1;
  DeepSlice *pDVar2;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  DeepSlice *fbslice;
  uint8_t *ptr;
  exr_coding_channel_info_t *curchan;
  int c;
  int64_t endY;
  char *in_stack_000000d8;
  DeepFrameBuffer *in_stack_000000e0;
  int local_24;
  
  *(int *)(in_RDI + 0xa8) = in_EDX - *(int *)(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 0xac) = 0;
  lVar1 = (long)*(int *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 0x14) + -1;
  if (in_ECX < lVar1) {
    *(int *)(in_RDI + 0xac) = (int)lVar1 - in_ECX;
  }
  if ((*(byte *)(in_RDI + 5) & 1) == 0) {
    for (local_24 = 0; local_24 < *(short *)(in_RDI + 0x58); local_24 = local_24 + 1) {
      lVar1 = *(long *)(in_RDI + 0x50) + (long)local_24 * 0x30;
      pDVar2 = DeepFrameBuffer::findSlice(in_stack_000000e0,in_stack_000000d8);
      if ((*(int *)(lVar1 + 8) == 0) || (pDVar2 == (DeepSlice *)0x0)) {
        *(undefined8 *)(lVar1 + 0x28) = 0;
        *(undefined4 *)(lVar1 + 0x20) = 0;
        *(undefined4 *)(lVar1 + 0x24) = 0;
      }
      else {
        *(short *)(lVar1 + 0x1c) = (short)*(undefined4 *)&(pDVar2->super_Slice).field_0x34;
        *(short *)(lVar1 + 0x1e) = (short)(pDVar2->super_Slice).type;
        *(int *)(lVar1 + 0x20) = (int)(pDVar2->super_Slice).xStride;
        *(int *)(lVar1 + 0x24) = (int)(pDVar2->super_Slice).yStride;
        *(char **)(lVar1 + 0x28) =
             (pDVar2->super_Slice).base +
             (long)in_EDX * (pDVar2->super_Slice).yStride +
             (long)*(int *)(in_RDI + 0xc) * (pDVar2->super_Slice).xStride;
      }
    }
  }
  return;
}

Assistant:

void ScanLineProcess::update_pointers (
    const DeepFrameBuffer *outfb, int fbY, int fbLastY)
{
    decoder.user_line_begin_skip = fbY - cinfo.start_y;
    decoder.user_line_end_ignore = 0;
    int64_t endY = (int64_t)cinfo.start_y + (int64_t)cinfo.height - 1;
    if ((int64_t)fbLastY < endY)
        decoder.user_line_end_ignore = (int32_t)(endY - fbLastY);

    if (counts_only)
        return;

    for (int c = 0; c < decoder.channel_count; ++c)
    {
        exr_coding_channel_info_t& curchan = decoder.channels[c];
        uint8_t*                   ptr;
        const DeepSlice*           fbslice;

        fbslice = outfb->findSlice (curchan.channel_name);

        if (curchan.height == 0 || !fbslice)
        {
            curchan.decode_to_ptr     = NULL;
            curchan.user_pixel_stride = 0;
            curchan.user_line_stride  = 0;
            continue;
        }

        curchan.user_bytes_per_element = fbslice->sampleStride;
        curchan.user_data_type         = (exr_pixel_type_t)fbslice->type;
        curchan.user_pixel_stride      = fbslice->xStride;
        curchan.user_line_stride       = fbslice->yStride;

        ptr  = reinterpret_cast<uint8_t*> (fbslice->base);
        ptr += int64_t (cinfo.start_x) * int64_t (fbslice->xStride);
        ptr += int64_t (fbY) * int64_t (fbslice->yStride);

        curchan.decode_to_ptr = ptr;
    }
}